

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

QBrush __thiscall QCss::Declaration::brushValue(Declaration *this,QPalette *pal)

{
  QPalettePrivate *pQVar1;
  PrivateShared *pPVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ColorRole cr;
  QBrush *pQVar6;
  QMetaType QVar7;
  QPalette *in_RDX;
  QPalettePrivate *pQVar8;
  long in_FS_OFFSET;
  undefined1 local_68 [24];
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = pal->d;
  if (pQVar8[1].data.d.ptr != (Data *)0x1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QBrush::QBrush((QBrush *)this);
      return (DataPtr)(DataPtr)this;
    }
    goto LAB_005e6c87;
  }
  if (pQVar8[2].data.d.ptr < (Data *)0x4) {
LAB_005e6b2c:
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    parseBrushValue((Value *)local_68,*(QPalette **)&pal->d[1].detach_no);
    if (local_68._12_4_ == 3) {
LAB_005e6c0b:
      QBrush::QBrush((QBrush *)this,(QBrush *)local_68);
    }
    else {
      if (local_68._12_4_ != 2) {
        ::QVariant::QVariant((QVariant *)&local_50,(QMetaType)0x7e54c8,local_68);
        ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)&local_50);
        ::QVariant::~QVariant((QVariant *)&local_50);
        goto LAB_005e6c0b;
      }
      if (_DAT_0081f954 == 0) {
        QMetaType::registerHelper
                  ((QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType);
      }
      ::QVariant::moveConstruct
                ((QMetaTypeInterface *)&local_50,
                 &QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType);
      ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)&local_50);
      ::QVariant::~QVariant((QVariant *)&local_50);
      pQVar6 = QPalette::brush(in_RDX,Current,local_68._8_4_);
      QBrush::QBrush((QBrush *)this,
                     &((pQVar6->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                       _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color,SolidPattern)
      ;
    }
    QBrush::~QBrush((QBrush *)local_68);
  }
  else {
    iVar5 = ::QVariant::typeId((QVariant *)(pQVar8 + 2));
    pQVar1 = pal->d;
    pQVar8 = pQVar1 + 2;
    if (iVar5 != 0x1002) {
      iVar5 = ::QVariant::typeId((QVariant *)pQVar8);
      if (iVar5 == 2) {
        cr = ::QVariant::toInt((bool *)(pal->d + 2));
        pQVar6 = QPalette::brush(in_RDX,Current,cr);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QBrush::QBrush((QBrush *)this,
                         &((pQVar6->d)._M_t.
                           super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color,
                         SolidPattern);
          return (DataPtr)(DataPtr)this;
        }
        goto LAB_005e6c87;
      }
      goto LAB_005e6b2c;
    }
    local_50._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    local_68._0_8_ = (ulong)pQVar1[2].data.d.ptr & 0xfffffffffffffffc;
    bVar4 = comparesEqual((QMetaType *)local_68,(QMetaType *)&local_50.shared);
    if (bVar4) {
      if (((ulong)pQVar1[2].data.d.ptr & 1) != 0) {
        pPVar2 = (((Private *)&pQVar8->ref)->data).shared;
        pQVar8 = (QPalettePrivate *)(pPVar2 + *(int *)(pPVar2 + 4));
      }
      QBrush::QBrush((QBrush *)this,(QBrush *)pQVar8);
    }
    else {
      (this->d).d.ptr = (DeclarationData *)&DAT_aaaaaaaaaaaaaaaa;
      QBrush::QBrush((QBrush *)this);
      QVar7.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)pQVar1[2].data.d.ptr & 1) != 0) {
        lVar3 = *(long *)&(pQVar8->ref).super_QAtomicInteger<int>;
        pQVar8 = (QPalettePrivate *)(*(int *)(lVar3 + 4) + lVar3);
      }
      QMetaType::convert(QVar7,pQVar8,(QMetaType)local_50._0_8_,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (DataPtr)(DataPtr)this;
  }
LAB_005e6c87:
  __stack_chk_fail();
}

Assistant:

QBrush Declaration::brushValue(const QPalette &pal) const
{
    if (d->values.size() != 1)
        return QBrush();

    if (d->parsed.isValid()) {
        if (d->parsed.userType() == QMetaType::QBrush)
            return qvariant_cast<QBrush>(d->parsed);
        if (d->parsed.userType() == QMetaType::Int)
            return pal.color((QPalette::ColorRole)(d->parsed.toInt()));
    }

    BrushData data = parseBrushValue(d->values.at(0), pal);

    if (data.type == BrushData::Role) {
        d->parsed = QVariant::fromValue<int>(data.role);
        return pal.color((QPalette::ColorRole)(data.role));
    } else {
        if (data.type != BrushData::DependsOnThePalette)
            d->parsed = QVariant::fromValue<QBrush>(data.brush);
        return data.brush;
    }
}